

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

Instr * __thiscall
GlobOpt::SetTypeCheckBailOut(GlobOpt *this,Opnd *opnd,Instr *instr,BailOutInfo *bailOutInfo)

{
  code *pcVar1;
  PropertySymOpnd **propertySymOpnd_00;
  BailOutInfo *instr_00;
  Instr *pIVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  BailOutKind BVar6;
  SymOpnd *this_00;
  undefined4 *puVar7;
  Instr *pIVar8;
  BailOutKind local_60;
  bool local_59;
  BailOutKind bailOutKind;
  bool isTypeCheckProtected;
  anon_class_32_4_595ba12a HandleBailout;
  PropertySymOpnd *propertySymOpnd;
  BailOutInfo *bailOutInfo_local;
  Instr *instr_local;
  Opnd *opnd_local;
  GlobOpt *this_local;
  
  propertySymOpnd = (PropertySymOpnd *)bailOutInfo;
  bailOutInfo_local = (BailOutInfo *)instr;
  instr_local = (Instr *)opnd;
  opnd_local = (Opnd *)this;
  bVar3 = IsLoopPrePass(this);
  if ((bVar3) || (bVar3 = IR::Opnd::IsSymOpnd((Opnd *)instr_local), !bVar3)) {
    this_local = (GlobOpt *)bailOutInfo_local;
  }
  else {
    this_00 = IR::Opnd::AsSymOpnd((Opnd *)instr_local);
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar3) {
      HandleBailout.propertySymOpnd =
           (PropertySymOpnd **)IR::Opnd::AsPropertySymOpnd((Opnd *)instr_local);
      bVar3 = IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate
                        ((PropertySymOpnd *)HandleBailout.propertySymOpnd);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x6ca,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                           "Property sym operand optimized despite not being a candidate?");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if ((propertySymOpnd != (PropertySymOpnd *)0x0) &&
         (bVar3 = IR::Instr::HasBailOutInfo((Instr *)bailOutInfo_local), bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x6cb,"(bailOutInfo == nullptr || !instr->HasBailOutInfo())",
                           "Why are we adding new bailout info to an instruction that already has it?"
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pIVar2 = instr_local;
      instr_00 = bailOutInfo_local;
      propertySymOpnd_00 = HandleBailout.propertySymOpnd;
      _bailOutKind = &bailOutInfo_local;
      HandleBailout.instr = (Instr **)&propertySymOpnd;
      HandleBailout.this = (GlobOpt *)&HandleBailout.propertySymOpnd;
      HandleBailout.bailOutInfo = (BailOutInfo **)this;
      pIVar8 = (Instr *)IR::Instr::GetDst((Instr *)bailOutInfo_local);
      bVar3 = NeedsTypeCheckBailOut
                        ((Instr *)instr_00,(PropertySymOpnd *)propertySymOpnd_00,pIVar2 == pIVar8,
                         &local_59,&local_60);
      if (bVar3) {
        SetTypeCheckBailOut::anon_class_32_4_595ba12a::operator()
                  ((anon_class_32_4_595ba12a *)&bailOutKind,local_60);
      }
      else if ((short)bailOutInfo_local->polymorphicCacheIndex == 0x1f5) {
        SetTypeCheckBailOut::anon_class_32_4_595ba12a::operator()
                  ((anon_class_32_4_595ba12a *)&bailOutKind,BailOutFailedInlineTypeCheck);
      }
      else {
        bVar3 = IR::Instr::HasBailOutInfo((Instr *)bailOutInfo_local);
        if (bVar3) {
          if ((short)bailOutInfo_local->polymorphicCacheIndex == 0x270) {
            uVar4 = Func::GetSourceContextId((Func *)bailOutInfo_local->usedCapturedValues);
            uVar5 = Func::GetLocalFunctionId((Func *)bailOutInfo_local->usedCapturedValues);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedMethodsPhase,uVar4,uVar5);
            if (bVar3) {
              uVar4 = Func::GetSourceContextId((Func *)bailOutInfo_local->usedCapturedValues);
              uVar5 = Func::GetLocalFunctionId((Func *)bailOutInfo_local->usedCapturedValues);
              bVar3 = Js::Phases::IsEnabled
                                ((Phases *)&DAT_01eafdf0,UseFixedDataPropsPhase,uVar4,uVar5);
              if (bVar3) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                   ,0x704,
                                   "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                                   ,"CheckFixedFld with fixed method/data phase disabled?");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
            }
            if ((local_59 & 1U) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                 ,0x705,"(isTypeCheckProtected)","isTypeCheckProtected");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            BVar6 = IR::Instr::GetBailOutKind((Instr *)bailOutInfo_local);
            if ((BVar6 != BailOutFailedFixedFieldTypeCheck) &&
               (BVar6 = IR::Instr::GetBailOutKind((Instr *)bailOutInfo_local),
               BVar6 != BailOutFailedEquivalentFixedFieldTypeCheck)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                 ,0x707,
                                 "(instr->GetBailOutKind() == IR::BailOutFailedFixedFieldTypeCheck || instr->GetBailOutKind() == IR::BailOutFailedEquivalentFixedFieldTypeCheck)"
                                 ,
                                 "Only BailOutFailed[Equivalent]FixedFieldTypeCheck can be safely removed.  Why does CheckFixedFld carry a different bailout kind?."
                                );
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            IR::Instr::ClearBailOutInfo((Instr *)bailOutInfo_local);
          }
          else {
            bVar3 = IR::PropertySymOpnd::MayNeedTypeCheckProtection
                              ((PropertySymOpnd *)HandleBailout.propertySymOpnd);
            if ((bVar3) &&
               (bVar3 = IR::PropertySymOpnd::IsTypeCheckProtected
                                  ((PropertySymOpnd *)HandleBailout.propertySymOpnd), bVar3)) {
              BVar6 = IR::Instr::GetBailOutKind((Instr *)bailOutInfo_local);
              if (BVar6 != BailOutMarkTempObject) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                                   ,0x70e,"(instr->GetBailOutKind() == IR::BailOutMarkTempObject)",
                                   "instr->GetBailOutKind() == IR::BailOutMarkTempObject");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              IR::Instr::ClearBailOutInfo((Instr *)bailOutInfo_local);
            }
          }
        }
      }
      this_local = (GlobOpt *)bailOutInfo_local;
    }
    else {
      this_local = (GlobOpt *)bailOutInfo_local;
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
GlobOpt::SetTypeCheckBailOut(IR::Opnd *opnd, IR::Instr *instr, BailOutInfo *bailOutInfo)
{
    if (this->IsLoopPrePass() || !opnd->IsSymOpnd())
    {
        return instr;
    }

    if (!opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return instr;
    }

    IR::PropertySymOpnd * propertySymOpnd = opnd->AsPropertySymOpnd();

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");
    AssertMsg(bailOutInfo == nullptr || !instr->HasBailOutInfo(), "Why are we adding new bailout info to an instruction that already has it?");

    auto HandleBailout = [&](IR::BailOutKind bailOutKind)->void {
        // At this point, we have a cached type that is live downstream or the type check is required
        // for a fixed field load. If we can't do away with the type check, then we're going to need bailout,
        // so lets add bailout info if we don't already have it.
        if (!instr->HasBailOutInfo())
        {
            if (bailOutInfo)
            {
                instr = instr->ConvertToBailOutInstr(bailOutInfo, bailOutKind);
            }
            else
            {
                GenerateBailAtOperation(&instr, bailOutKind);
                BailOutInfo *bailOutInfo = instr->GetBailOutInfo();

                // Consider (ObjTypeSpec): If we're checking a fixed field here the bailout could be due to polymorphism or
                // due to a fixed field turning non-fixed. Consider distinguishing between the two.
                bailOutInfo->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
            }
        }
        else if (instr->GetBailOutKind() == IR::BailOutMarkTempObject)
        {
            Assert(!bailOutInfo);
            Assert(instr->GetBailOutInfo()->polymorphicCacheIndex == -1);
            instr->SetBailOutKind(bailOutKind | IR::BailOutMarkTempObject);
            instr->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        else
        {
            Assert(bailOutKind == instr->GetBailOutKind());
        }
    };

    bool isTypeCheckProtected;
    IR::BailOutKind bailOutKind;
    if (GlobOpt::NeedsTypeCheckBailOut(instr, propertySymOpnd, opnd == instr->GetDst(), &isTypeCheckProtected, &bailOutKind))
    {
        HandleBailout(bailOutKind);
    }
    else
    {
        if (instr->m_opcode == Js::OpCode::LdMethodFromFlags)
        {
            // If LdMethodFromFlags is hoisted to the top of the loop, we should share the same bailout Info.
            // We don't need to do anything for LdMethodFromFlags that cannot be field hoisted.
            HandleBailout(IR::BailOutFailedInlineTypeCheck);
        }
        else if (instr->HasBailOutInfo())
        {
            // If we already have a bailout info, but don't actually need it, let's remove it. This can happen if
            // a CheckFixedFld added by the inliner (with bailout info) determined that the object's type has
            // been checked upstream and no bailout is necessary here.
            if (instr->m_opcode == Js::OpCode::CheckFixedFld)
            {
                AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instr->m_func) ||
                    !PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func), "CheckFixedFld with fixed method/data phase disabled?");
                Assert(isTypeCheckProtected);
                AssertMsg(instr->GetBailOutKind() == IR::BailOutFailedFixedFieldTypeCheck || instr->GetBailOutKind() == IR::BailOutFailedEquivalentFixedFieldTypeCheck,
                    "Only BailOutFailed[Equivalent]FixedFieldTypeCheck can be safely removed.  Why does CheckFixedFld carry a different bailout kind?.");
                instr->ClearBailOutInfo();
            }
            else if (propertySymOpnd->MayNeedTypeCheckProtection() && propertySymOpnd->IsTypeCheckProtected())
            {
                // Both the type and (if necessary) the proto object have been checked.
                // We're doing a direct slot access. No possibility of bailout here (not even implicit call).
                Assert(instr->GetBailOutKind() == IR::BailOutMarkTempObject);
                instr->ClearBailOutInfo();
            }
        }
    }

    return instr;
}